

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::bson::
basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_string(basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
               *this,string_view_type *sv,semantic_tag tag,ser_context *param_4,error_code *ec)

{
  const_iterator __position;
  bool bVar1;
  int iVar2;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> d_first;
  const_pointer val;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  size_type sVar3;
  error_code *this_01;
  const_iterator pvVar4;
  size_type sVar5;
  char in_DL;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  decimal128_from_chars_result dVar6;
  type tVar7;
  size_t length;
  value_type c_2;
  const_iterator __end4_3;
  const_iterator __begin4_3;
  string_view_type *__range4_3;
  type sink;
  size_t string_offset;
  decimal128_t *in_stack_000000b0;
  char *in_stack_000000b8;
  size_t offset;
  value_type c_1;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  string_view *__range4_2;
  string_view options;
  value_type c;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  string_view *__range4_1;
  string_view regex;
  size_t last;
  size_t first;
  value_type_conflict b;
  iterator __end4;
  iterator __begin4;
  oid_t *__range4;
  oid_t oid;
  decimal128_from_chars_result rc;
  decimal128_t dec;
  undefined7 in_stack_fffffffffffffe38;
  char in_stack_fffffffffffffe3f;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  value_type_conflict *in_stack_fffffffffffffe48;
  bson_errc bVar8;
  error_code *in_stack_fffffffffffffe50;
  string_view *in_stack_fffffffffffffe58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  uint val_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  char cVar9;
  const_iterator local_150;
  undefined8 in_stack_fffffffffffffef8;
  uint8_t code;
  undefined5 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  const_iterator local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  undefined1 local_cb;
  value_type local_ca;
  value_type local_c9;
  const_iterator local_c8;
  const_iterator local_c0;
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  size_type local_a0;
  size_type local_98;
  value_type_conflict local_89;
  iterator local_88;
  iterator local_80;
  undefined1 *local_78;
  undefined1 local_6c [12];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_58;
  char *local_50;
  errc local_48;
  TP1 local_40 [2];
  char local_19;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  
  code = (uint8_t)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  local_19 = in_DL;
  local_18 = in_RSI;
  bVar1 = std::
          vector<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
          ::empty((vector<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
                   *)in_stack_fffffffffffffe50);
  if (bVar1) {
    std::error_code::operator=
              (in_stack_fffffffffffffe50,(bson_errc)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  }
  else if (local_19 == '\v') {
    before_value((basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                  *)CONCAT17(in_stack_ffffffffffffff07,
                             CONCAT16(in_stack_ffffffffffffff06,
                                      CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))
                            ),code);
    bVar8 = (bson_errc)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    TP1::TP1(local_40);
    d_first.container =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data(local_18);
    val = std::basic_string_view<char,_std::char_traits<char>_>::data(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::size(local_18);
    dVar6 = decimal128_from_chars((char *)offset,in_stack_000000b8,in_stack_000000b0);
    local_50 = dVar6.ptr;
    local_48 = dVar6.ec;
    if (local_48 == 0) {
      local_58 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      binary::
      native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                ((unsigned_long)val,d_first);
      local_60 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      binary::
      native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                ((unsigned_long)val,d_first);
    }
    else {
      std::error_code::operator=(in_stack_fffffffffffffe50,bVar8);
    }
  }
  else if (local_19 == '\x13') {
    before_value((basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                  *)CONCAT17(in_stack_ffffffffffffff07,
                             CONCAT16(in_stack_ffffffffffffff06,
                                      CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))
                            ),code);
    oid_t::oid_t((oid_t *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_78 = local_6c;
    local_80 = oid_t::begin((oid_t *)0x26874a);
    local_88 = oid_t::end((oid_t *)0x26875f);
    for (; local_80 != local_88; local_80 = local_80 + 1) {
      local_89 = *local_80;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48);
    }
  }
  else if (local_19 == '\x14') {
    before_value((basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                  *)CONCAT17(in_stack_ffffffffffffff07,
                             CONCAT16(in_stack_ffffffffffffff06,
                                      CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))
                            ),code);
    bVar8 = (bson_errc)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    local_98 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe3f,0x2687e0);
    local_a0 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe3f,0x268801);
    if (((local_98 == 0xffffffffffffffff) || (local_a0 == 0xffffffffffffffff)) ||
       (local_98 == local_a0)) {
      std::error_code::operator=(in_stack_fffffffffffffe50,bVar8);
    }
    else {
      local_b0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58,
                            (size_type)in_stack_fffffffffffffe50);
      local_b8 = &local_b0;
      local_c0 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_b8);
      local_c8 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_b8);
      for (; local_c0 != local_c8; local_c0 = local_c0 + 1) {
        local_ca = *local_c0;
        local_c9 = local_ca;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (value_type_conflict *)
                   CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      }
      local_cb = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (value_type_conflict *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      local_e0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58,
                            (size_type)in_stack_fffffffffffffe50);
      local_f0 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_e0);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_e0);
      for (; local_f0 != pvVar4; local_f0 = local_f0 + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (value_type_conflict *)
                   CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (value_type_conflict *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    }
  }
  else {
    if (local_19 == '\x15') {
      before_value((basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                    *)CONCAT17(in_stack_ffffffffffffff07,
                               CONCAT16(in_stack_ffffffffffffff06,
                                        CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00
                                                ))),code);
      cVar9 = local_19;
    }
    else {
      before_value((basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                    *)CONCAT17(in_stack_ffffffffffffff07,
                               CONCAT16(in_stack_ffffffffffffff06,
                                        CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00
                                                ))),code);
      cVar9 = local_19;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48));
    this_00 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)(in_RDI + 0x48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    __position._M_current._7_1_ = cVar9;
    __position._M_current._0_7_ = in_stack_fffffffffffffe78;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe70._M_current,__position,in_stack_fffffffffffffe68,
               (value_type_conflict *)in_stack_fffffffffffffe60);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48));
    this_01 = (error_code *)std::basic_string_view<char,_std::char_traits<char>_>::data(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::size(local_18);
    tVar7 = unicode_traits::validate<char>
                      ((char *)in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    if (tVar7.ec == success) {
      local_150 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_18);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_18);
      for (; val_00 = (uint)(in_stack_fffffffffffffe68 >> 0x20), local_150 != pvVar4;
          local_150 = local_150 + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (value_type_conflict *)
                   CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (value_type_conflict *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48));
      iVar2 = (int)sVar5 - (int)sVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+(this_00,CONCAT44(iVar2,in_stack_fffffffffffffe40));
      binary::
      native_to_little<unsigned_int,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                (val_00,in_stack_fffffffffffffe70);
    }
    else {
      std::error_code::operator=(this_01,(bson_errc)((ulong)this_00 >> 0x20));
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code& ec) override
    {
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }

        switch (tag)
        {
            case semantic_tag::float128:
            {
                before_value(jsoncons::bson::bson_type::decimal128_type);
                decimal128_t dec;
                auto rc = decimal128_from_chars(sv.data(), sv.data()+sv.size(), dec);
                if (rc.ec != std::errc())
                {
                    ec = bson_errc::invalid_decimal128_string;
                    JSONCONS_VISITOR_RETURN;
                }
                binary::native_to_little(dec.low,std::back_inserter(buffer_));
                binary::native_to_little(dec.high,std::back_inserter(buffer_));
                break;
            }
            case semantic_tag::id:
            {
                before_value(jsoncons::bson::bson_type::object_id_type);
                oid_t oid(sv);
                for (auto b : oid)
                {
                    buffer_.push_back(b);
                }
                break;
            }
            case semantic_tag::regex:
            {
                before_value(jsoncons::bson::bson_type::regex_type);
                std::size_t first = sv.find_first_of('/');
                std::size_t last = sv.find_last_of('/');
                if (first == string_view::npos || last == string_view::npos || first == last)
                {
                    ec = bson_errc::invalid_regex_string;
                    JSONCONS_VISITOR_RETURN;
                }
                string_view regex = sv.substr(first+1,last-1);
                for (auto c : regex)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                string_view options = sv.substr(last+1);
                for (auto c : options)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                break;
            }
            default:
                switch (tag)
                {
                    case semantic_tag::code:
                        before_value(jsoncons::bson::bson_type::javascript_type);
                        break;
                    default:
                        before_value(jsoncons::bson::bson_type::string_type);
                        break;
                }
                std::size_t offset = buffer_.size();
                buffer_.insert(buffer_.end(), sizeof(int32_t), 0);
                std::size_t string_offset = buffer_.size();
                auto sink = unicode_traits::validate(sv.data(), sv.size());
                if (sink.ec != unicode_traits::conv_errc())
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    JSONCONS_VISITOR_RETURN;
                }
                for (auto c : sv)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                std::size_t length = buffer_.size() - string_offset;
                binary::native_to_little(static_cast<uint32_t>(length), buffer_.begin()+offset);
                break;
        }

        JSONCONS_VISITOR_RETURN;
    }